

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O0

uint64_t __thiscall
spvtools::opt::ScalarReplacementPass::GetArrayLength
          (ScalarReplacementPass *this,Instruction *arrayType)

{
  Op OVar1;
  uint32_t id;
  DefUseManager *this_00;
  Instruction *inst;
  IRContext *this_01;
  ConstantManager *this_02;
  Constant *this_03;
  uint64_t uVar2;
  Instruction *length;
  Instruction *arrayType_local;
  ScalarReplacementPass *this_local;
  
  OVar1 = opt::Instruction::opcode(arrayType);
  if (OVar1 == OpTypeArray) {
    this_00 = Pass::get_def_use_mgr((Pass *)this);
    id = opt::Instruction::GetSingleWordInOperand(arrayType,1);
    inst = analysis::DefUseManager::GetDef(this_00,id);
    this_01 = Pass::context((Pass *)this);
    this_02 = IRContext::get_constant_mgr(this_01);
    this_03 = analysis::ConstantManager::GetConstantFromInst(this_02,inst);
    uVar2 = analysis::Constant::GetZeroExtendedValue(this_03);
    return uVar2;
  }
  __assert_fail("arrayType->opcode() == spv::Op::OpTypeArray",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                ,0x238,
                "uint64_t spvtools::opt::ScalarReplacementPass::GetArrayLength(const Instruction *) const"
               );
}

Assistant:

uint64_t ScalarReplacementPass::GetArrayLength(
    const Instruction* arrayType) const {
  assert(arrayType->opcode() == spv::Op::OpTypeArray);
  const Instruction* length =
      get_def_use_mgr()->GetDef(arrayType->GetSingleWordInOperand(1u));
  return context()
      ->get_constant_mgr()
      ->GetConstantFromInst(length)
      ->GetZeroExtendedValue();
}